

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

optional<pbrt::ShapeSample> * __thiscall
pbrt::BilinearPatch::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,BilinearPatch *this,
          ShapeSampleContext *ctx,Point2f u)

{
  Point3f *pPVar1;
  Point3f *s;
  Point3f *pPVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar11;
  undefined8 uVar10;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  BilinearPatchMesh *mesh;
  int *piVar25;
  Point3f *pPVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  byte bVar32;
  anon_struct_8_0_00000001_for___align aVar33;
  undefined1 auVar34 [16];
  bool bVar35;
  long lVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar46 [48];
  undefined1 auVar42 [64];
  undefined1 auVar44 [64];
  Float FVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined8 in_XMM0_Qb;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [56];
  undefined1 auVar56 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined4 uVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  Vector3f a;
  Point3f PVar106;
  Vector3f b;
  Vector3f c;
  Vector3f d;
  Float quadPDF;
  float local_148;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  float local_cc;
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_c8;
  bool local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Tuple3<pbrt::Vector3,_float> local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  undefined1 auVar43 [64];
  undefined1 auVar45 [64];
  
  fVar48 = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
  local_128._8_8_ = in_XMM0_Qb;
  local_128._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  auVar37._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar37._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar37._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar37._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  fVar49 = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
  auVar37 = vinsertps_avx(auVar37,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  mesh = *(BilinearPatchMesh **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar36 = (long)this->blpIndex;
  piVar25 = mesh->vertexIndices;
  pPVar26 = mesh->p;
  iVar21 = piVar25[lVar36 * 4];
  iVar22 = piVar25[lVar36 * 4 + 1];
  fVar53 = pPVar26[iVar21].super_Tuple3<pbrt::Point3,_float>.z;
  local_68._0_4_ = pPVar26[iVar21].super_Tuple3<pbrt::Point3,_float>.x;
  local_68._4_4_ = pPVar26[iVar21].super_Tuple3<pbrt::Point3,_float>.y;
  iVar23 = piVar25[lVar36 * 4 + 2];
  iVar24 = piVar25[lVar36 * 4 + 3];
  fVar50 = pPVar26[iVar22].super_Tuple3<pbrt::Point3,_float>.z;
  uStack_60 = 0;
  uVar3 = pPVar26[iVar23].super_Tuple3<pbrt::Point3,_float>.x;
  uVar11 = pPVar26[iVar23].super_Tuple3<pbrt::Point3,_float>.y;
  local_108._4_4_ = uVar11;
  local_108._0_4_ = uVar3;
  fVar85 = pPVar26[iVar23].super_Tuple3<pbrt::Point3,_float>.z;
  local_108._8_8_ = 0;
  fVar51 = pPVar26[iVar24].super_Tuple3<pbrt::Point3,_float>.z;
  uVar10 = *(undefined8 *)
            &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
  auVar54._0_4_ = (float)uVar10 + auVar37._0_4_;
  auVar54._4_4_ = (float)((ulong)uVar10 >> 0x20) + auVar37._4_4_;
  auVar54._8_4_ = auVar37._8_4_ + 0.0;
  auVar54._12_4_ = auVar37._12_4_ + 0.0;
  uVar4 = pPVar26[iVar22].super_Tuple3<pbrt::Point3,_float>.x;
  uVar12 = pPVar26[iVar22].super_Tuple3<pbrt::Point3,_float>.y;
  local_118._4_4_ = uVar12;
  local_118._0_4_ = uVar4;
  auVar39._8_4_ = 0x3f000000;
  auVar39._0_8_ = 0x3f0000003f000000;
  auVar39._12_4_ = 0x3f000000;
  auVar46 = in_ZmmResult._16_48_;
  auVar37 = vmulps_avx512vl(auVar54,auVar39);
  local_118._8_8_ = 0;
  uVar5 = pPVar26[iVar24].super_Tuple3<pbrt::Point3,_float>.x;
  uVar13 = pPVar26[iVar24].super_Tuple3<pbrt::Point3,_float>.y;
  local_f8._4_4_ = uVar13;
  local_f8._0_4_ = uVar5;
  local_f8._8_8_ = 0;
  bVar35 = IsRectangle(this,mesh);
  if ((bVar35) && (mesh->imageDistribution == (PiecewiseConstant2D *)0x0)) {
    fVar48 = (fVar48 + fVar49) * 0.5;
    fVar53 = fVar53 - fVar48;
    fVar50 = fVar50 - fVar48;
    fVar85 = fVar85 - fVar48;
    fVar51 = fVar51 - fVar48;
    auVar38._8_8_ = uStack_60;
    auVar38._0_8_ = local_68;
    auVar54 = vsubps_avx(auVar38,auVar37);
    auVar86._0_4_ = auVar54._0_4_ * auVar54._0_4_;
    auVar86._4_4_ = auVar54._4_4_ * auVar54._4_4_;
    auVar86._8_4_ = auVar54._8_4_ * auVar54._8_4_;
    auVar86._12_4_ = auVar54._12_4_ * auVar54._12_4_;
    auVar39 = vhaddps_avx(auVar86,auVar86);
    auVar39 = ZEXT416((uint)(auVar39._0_4_ + fVar53 * fVar53));
    auVar39 = vsqrtss_avx(auVar39,auVar39);
    fVar48 = auVar39._0_4_;
    auVar87._4_4_ = fVar48;
    auVar87._0_4_ = fVar48;
    auVar87._8_4_ = fVar48;
    auVar87._12_4_ = fVar48;
    a.super_Tuple3<pbrt::Vector3,_float>.z = fVar53 / fVar48;
    auVar39 = vdivps_avx(auVar54,auVar87);
    auVar38 = vsubps_avx(local_118,auVar37);
    auVar40._0_4_ = auVar38._0_4_ * auVar38._0_4_;
    auVar40._4_4_ = auVar38._4_4_ * auVar38._4_4_;
    auVar40._8_4_ = auVar38._8_4_ * auVar38._8_4_;
    auVar40._12_4_ = auVar38._12_4_ * auVar38._12_4_;
    auVar54 = vhaddps_avx(auVar40,auVar40);
    auVar54 = ZEXT416((uint)(auVar54._0_4_ + fVar50 * fVar50));
    auVar54 = vsqrtss_avx(auVar54,auVar54);
    fVar48 = auVar54._0_4_;
    auVar41._4_4_ = fVar48;
    auVar41._0_4_ = fVar48;
    auVar41._8_4_ = fVar48;
    auVar41._12_4_ = fVar48;
    b.super_Tuple3<pbrt::Vector3,_float>.z = fVar50 / fVar48;
    auVar54 = vdivps_avx(auVar38,auVar41);
    auVar86 = vsubps_avx(local_108,auVar37);
    auVar88._0_4_ = auVar86._0_4_ * auVar86._0_4_;
    auVar88._4_4_ = auVar86._4_4_ * auVar86._4_4_;
    auVar88._8_4_ = auVar86._8_4_ * auVar86._8_4_;
    auVar88._12_4_ = auVar86._12_4_ * auVar86._12_4_;
    auVar38 = vhaddps_avx(auVar88,auVar88);
    auVar38 = ZEXT416((uint)(auVar38._0_4_ + fVar85 * fVar85));
    auVar38 = vsqrtss_avx(auVar38,auVar38);
    fVar48 = auVar38._0_4_;
    auVar81._4_4_ = fVar48;
    auVar81._0_4_ = fVar48;
    auVar81._8_4_ = fVar48;
    auVar81._12_4_ = fVar48;
    d.super_Tuple3<pbrt::Vector3,_float>.z = fVar85 / fVar48;
    auVar38 = vdivps_avx(auVar86,auVar81);
    auVar86 = vsubps_avx(local_f8,auVar37);
    auVar99._0_4_ = auVar86._0_4_ * auVar86._0_4_;
    auVar99._4_4_ = auVar86._4_4_ * auVar86._4_4_;
    auVar99._8_4_ = auVar86._8_4_ * auVar86._8_4_;
    auVar99._12_4_ = auVar86._12_4_ * auVar86._12_4_;
    auVar37 = vhaddps_avx(auVar99,auVar99);
    auVar37 = ZEXT416((uint)(auVar37._0_4_ + fVar51 * fVar51));
    auVar37 = vsqrtss_avx(auVar37,auVar37);
    fVar48 = auVar37._0_4_;
    auVar95._4_4_ = fVar48;
    auVar95._0_4_ = fVar48;
    auVar95._8_4_ = fVar48;
    auVar95._12_4_ = fVar48;
    c.super_Tuple3<pbrt::Vector3,_float>.z = fVar51 / fVar48;
    auVar37 = vdivps_avx(auVar86,auVar95);
    a.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar39._0_8_;
    b.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar54._0_8_;
    c.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar37._0_8_;
    d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar38._0_8_;
    FVar47 = SphericalQuadArea(a,b,c,d);
    if (0.0001 < FVar47) {
      pPVar1 = pPVar26 + iVar22;
      s = pPVar26 + iVar21;
      pPVar2 = pPVar26 + iVar23;
      auVar37 = ZEXT816(0) << 0x40;
      uVar27._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
      uVar27._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar27;
      fVar50 = (s->super_Tuple3<pbrt::Point3,_float>).y;
      fVar85 = (s->super_Tuple3<pbrt::Point3,_float>).z;
      local_40.z = (pPVar1->super_Tuple3<pbrt::Point3,_float>).z;
      uVar6 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).x;
      uVar14 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).y;
      auVar58._4_4_ = uVar14;
      auVar58._0_4_ = uVar6;
      auVar58._8_8_ = 0;
      local_50.z = (pPVar2->super_Tuple3<pbrt::Point3,_float>).z;
      fVar48 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x;
      fVar49 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
      fVar53 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
      if ((((fVar48 != 0.0) || (fVar49 != 0.0)) || (NAN(fVar49))) ||
         ((fVar53 != 0.0 || (NAN(fVar53))))) {
        auVar19._0_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
        ;
        auVar19._4_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
        auVar19._8_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
        ;
        auVar19._12_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             high;
        auVar39 = vinsertps_avx(ZEXT416((uint)fVar85),ZEXT416((uint)local_40.z),0x10);
        auVar92._4_4_ = fVar53;
        auVar92._0_4_ = fVar53;
        auVar92._8_4_ = fVar53;
        auVar92._12_4_ = fVar53;
        auVar90._4_4_ = fVar49;
        auVar90._0_4_ = fVar49;
        auVar90._8_4_ = fVar49;
        auVar90._12_4_ = fVar49;
        auVar82._4_4_ = fVar48;
        auVar82._0_4_ = fVar48;
        auVar82._8_4_ = fVar48;
        auVar82._12_4_ = fVar48;
        auVar54 = vinsertps_avx(auVar19,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                      high),0x10);
        fVar48 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  z.low + (ctx->pi).super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
        pPVar26 = pPVar26 + iVar24;
        auVar40 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar67,
                                     ZEXT416((uint)(s->super_Tuple3<pbrt::Point3,_float>).x));
        auVar68._4_4_ = uVar27._4_4_;
        auVar68._0_4_ = fVar50;
        auVar68._8_8_ = 0;
        auVar73._4_4_ = fVar48;
        auVar73._0_4_ = fVar48;
        auVar73._8_4_ = fVar48;
        auVar73._12_4_ = fVar48;
        uVar10 = *(undefined8 *)
                  &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.high;
        auVar38 = vinsertps_avx(ZEXT416((uint)(pPVar26->super_Tuple3<pbrt::Point3,_float>).z),
                                ZEXT416((uint)local_50.z),0x10);
        auVar86 = vsubps_avx(auVar39,auVar73);
        auVar87 = vsubps_avx(auVar38,auVar73);
        auVar96._0_4_ = (float)uVar10 + auVar54._0_4_;
        auVar96._4_4_ = (float)((ulong)uVar10 >> 0x20) + auVar54._4_4_;
        auVar96._8_4_ = auVar54._8_4_ + 0.0;
        auVar96._12_4_ = auVar54._12_4_ + 0.0;
        auVar29._8_4_ = 0x3f000000;
        auVar29._0_8_ = 0x3f0000003f000000;
        auVar29._12_4_ = 0x3f000000;
        auVar41 = vmulps_avx512vl(auVar96,auVar29);
        uVar94 = auVar41._0_4_;
        auVar100._4_4_ = uVar94;
        auVar100._0_4_ = uVar94;
        auVar100._8_4_ = uVar94;
        auVar100._12_4_ = uVar94;
        auVar39 = vmovshdup_avx(auVar41);
        auVar81 = vsubps_avx(auVar58,auVar41);
        auVar54 = vsubps_avx(auVar68,auVar39);
        auVar40 = vsubps_avx(auVar40,auVar100);
        auVar77._0_4_ =
             auVar40._0_4_ * auVar40._0_4_ + auVar54._0_4_ * auVar54._0_4_ +
             auVar86._0_4_ * auVar86._0_4_;
        auVar77._4_4_ =
             auVar40._4_4_ * auVar40._4_4_ + auVar54._4_4_ * auVar54._4_4_ +
             auVar86._4_4_ * auVar86._4_4_;
        auVar77._8_4_ =
             auVar40._8_4_ * auVar40._8_4_ + auVar54._8_4_ * auVar54._8_4_ +
             auVar86._8_4_ * auVar86._8_4_;
        auVar77._12_4_ =
             auVar40._12_4_ * auVar40._12_4_ + auVar54._12_4_ * auVar54._12_4_ +
             auVar86._12_4_ * auVar86._12_4_;
        auVar38 = vsqrtps_avx(auVar77);
        auVar39 = vdivps_avx(auVar86,auVar38);
        auVar54 = vdivps_avx(auVar54,auVar38);
        auVar38 = vdivps_avx(auVar40,auVar38);
        auVar78._0_4_ = fVar53 * auVar39._0_4_;
        auVar78._4_4_ = fVar53 * auVar39._4_4_;
        auVar78._8_4_ = fVar53 * auVar39._8_4_;
        auVar78._12_4_ = fVar53 * auVar39._12_4_;
        auVar54 = vfmadd213ps_fma(auVar54,auVar90,auVar78);
        auVar39 = vfmsub213ps_fma(auVar39,auVar92,auVar78);
        auVar79._8_4_ = 0x3c23d70a;
        auVar79._0_8_ = 0x3c23d70a3c23d70a;
        auVar79._12_4_ = 0x3c23d70a;
        auVar63._0_4_ = auVar54._0_4_ + auVar39._0_4_;
        auVar63._4_4_ = auVar54._4_4_ + auVar39._4_4_;
        auVar63._8_4_ = auVar54._8_4_ + auVar39._8_4_;
        auVar63._12_4_ = auVar54._12_4_ + auVar39._12_4_;
        auVar69._8_4_ = 0x7fffffff;
        auVar69._0_8_ = 0x7fffffff7fffffff;
        auVar69._12_4_ = 0x7fffffff;
        auVar39 = vfmadd231ps_fma(auVar63,auVar82,auVar38);
        uVar7 = (pPVar26->super_Tuple3<pbrt::Point3,_float>).x;
        uVar15 = (pPVar26->super_Tuple3<pbrt::Point3,_float>).y;
        auVar101._4_4_ = uVar15;
        auVar101._0_4_ = uVar7;
        auVar101._8_8_ = 0;
        auVar39 = vandps_avx(auVar39,auVar69);
        auVar86 = vmaxps_avx(auVar39,auVar79);
        auVar64._0_4_ = auVar81._0_4_ * auVar81._0_4_;
        auVar64._4_4_ = auVar81._4_4_ * auVar81._4_4_;
        auVar64._8_4_ = auVar81._8_4_ * auVar81._8_4_;
        auVar64._12_4_ = auVar81._12_4_ * auVar81._12_4_;
        auVar54 = vsubps_avx(auVar101,auVar41);
        auVar102._0_4_ = auVar54._0_4_ * auVar54._0_4_;
        auVar102._4_4_ = auVar54._4_4_ * auVar54._4_4_;
        auVar102._8_4_ = auVar54._8_4_ * auVar54._8_4_;
        auVar102._12_4_ = auVar54._12_4_ * auVar54._12_4_;
        auVar39 = vhaddps_avx(auVar102,auVar64);
        auVar39 = vshufps_avx(auVar39,auVar39,0xe8);
        auVar65._0_4_ = auVar39._0_4_ + auVar87._0_4_ * auVar87._0_4_;
        auVar65._4_4_ = auVar39._4_4_ + auVar87._4_4_ * auVar87._4_4_;
        auVar65._8_4_ = auVar39._8_4_ + auVar87._8_4_ * auVar87._8_4_;
        auVar65._12_4_ = auVar39._12_4_ + auVar87._12_4_ * auVar87._12_4_;
        auVar38 = vinsertps_avx(auVar54,auVar81,0x1c);
        auVar54 = vinsertps_avx(auVar81,auVar54,0x4c);
        auVar81 = vsqrtps_avx(auVar65);
        auVar39 = vdivps_avx(auVar87,auVar81);
        auVar54 = vdivps_avx(auVar54,auVar81);
        auVar38 = vdivps_avx(auVar38,auVar81);
        auVar66._0_4_ = fVar53 * auVar39._0_4_;
        auVar66._4_4_ = fVar53 * auVar39._4_4_;
        auVar66._8_4_ = fVar53 * auVar39._8_4_;
        auVar66._12_4_ = fVar53 * auVar39._12_4_;
        auVar81 = vfmadd213ps_fma(auVar54,auVar90,auVar66);
        auVar39 = vfmsub213ps_fma(auVar39,auVar92,auVar66);
        auVar54 = vmovshdup_avx(auVar86);
        fVar48 = auVar86._0_4_ + auVar54._0_4_;
        auVar55._0_4_ = auVar81._0_4_ + auVar39._0_4_;
        auVar55._4_4_ = auVar81._4_4_ + auVar39._4_4_;
        auVar55._8_4_ = auVar81._8_4_ + auVar39._8_4_;
        auVar55._12_4_ = auVar81._12_4_ + auVar39._12_4_;
        auVar39 = vfmadd231ps_fma(auVar55,auVar82,auVar38);
        auVar39 = vandps_avx(auVar39,auVar69);
        uVar27 = vcmpps_avx512vl(auVar79,auVar39,1);
        auVar38 = vshufps_avx(auVar39,auVar39,0xf5);
        bVar32 = (byte)(uVar27 >> 1);
        auVar43._16_48_ = auVar46;
        auVar43._0_16_ = SUB6416(ZEXT464(0x3c23d70a),0);
        auVar42._4_60_ = auVar43._4_60_;
        auVar42._0_4_ =
             (float)((uint)(bVar32 & 1) * auVar38._0_4_ + (uint)!(bool)(bVar32 & 1) * 0x3c23d70a);
        auVar45._16_48_ = auVar46;
        auVar45._0_16_ = SUB6416(ZEXT464(0x3c23d70a),0);
        auVar44._4_60_ = auVar45._4_60_;
        auVar44._0_4_ =
             (float)((uint)((byte)uVar27 & 1) * auVar39._0_4_ +
                    (uint)!(bool)((byte)uVar27 & 1) * 0x3c23d70a);
        auVar39 = vmovshdup_avx(local_128);
        fVar49 = auVar39._0_4_;
        if (((fVar49 != 0.0) || ((NAN(fVar49) || (fVar48 != 0.0)))) || (NAN(fVar48))) {
          fVar53 = auVar42._0_4_ + auVar44._0_4_;
          auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar49 * fVar53 * fVar53)),
                                    ZEXT416((uint)(fVar48 * fVar48)),ZEXT416((uint)(1.0 - fVar49)));
          if (auVar37._0_4_ < 0.0) {
            fVar50 = sqrtf(auVar37._0_4_);
          }
          else {
            auVar37 = vsqrtss_avx(auVar37,auVar37);
            fVar50 = auVar37._0_4_;
          }
          auVar37 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                               ZEXT416((uint)((fVar49 * (fVar48 + fVar53)) / (fVar48 + fVar50))));
        }
        fVar85 = auVar37._0_4_;
        auVar39 = ZEXT816(0) << 0x20;
        fVar53 = u.super_Tuple2<pbrt::Point2,_float>.x;
        fVar49 = 1.0 - fVar85;
        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar85 * auVar42._0_4_)),ZEXT416((uint)fVar49),
                                  auVar86);
        fVar50 = auVar38._0_4_;
        if ((((fVar53 != 0.0) || (NAN(fVar53))) || (fVar50 != 0.0)) || (NAN(fVar50))) {
          auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar85 * auVar44._0_4_)),ZEXT416((uint)fVar49),
                                    auVar54);
          fVar51 = auVar39._0_4_;
          auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fVar51 * fVar51)),
                                    ZEXT416((uint)(fVar50 * fVar50)),ZEXT416((uint)(1.0 - fVar53)));
          if (auVar39._0_4_ < 0.0) {
            fVar52 = sqrtf(auVar39._0_4_);
          }
          else {
            auVar39 = vsqrtss_avx(auVar39,auVar39);
            fVar52 = auVar39._0_4_;
          }
          auVar39 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                               ZEXT416((uint)((fVar53 * (fVar50 + fVar51)) / (fVar50 + fVar52))));
        }
        local_148 = 0.0;
        fVar53 = auVar39._0_4_;
        if (((0.0 <= fVar53) && (fVar53 <= 1.0)) && ((0.0 <= fVar85 && (fVar85 <= 1.0)))) {
          fVar48 = fVar48 + auVar42._0_4_ + auVar44._0_4_;
          if ((fVar48 != 0.0) || (local_148 = 1.0, NAN(fVar48))) {
            auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar49 * fVar53)),auVar86,
                                      ZEXT416((uint)(fVar49 * (1.0 - fVar53))));
            auVar54 = vfmadd213ss_fma(auVar42._0_16_,ZEXT416((uint)(fVar85 * (1.0 - fVar53))),
                                      auVar54);
            auVar54 = vfmadd213ss_fma(auVar44._0_16_,ZEXT416((uint)(fVar85 * fVar53)),auVar54);
            local_148 = (auVar54._0_4_ * 4.0) / fVar48;
          }
        }
        uVar8 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
        uVar16 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
        auVar67._4_4_ = uVar16;
        auVar67._0_4_ = uVar8;
        auVar67._8_8_ = 0;
        fVar50 = (s->super_Tuple3<pbrt::Point3,_float>).y;
        fVar85 = (s->super_Tuple3<pbrt::Point3,_float>).z;
        local_40.z = (pPVar1->super_Tuple3<pbrt::Point3,_float>).z;
        uVar9 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).x;
        uVar17 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).y;
        auVar58._4_4_ = uVar17;
        auVar58._0_4_ = uVar9;
        auVar58._8_8_ = 0;
        local_50.z = (pPVar2->super_Tuple3<pbrt::Point3,_float>).z;
        local_128 = vinsertps_avx(auVar39,auVar37,0x10);
      }
      else {
        local_148 = 1.0;
      }
      auVar57 = ZEXT856(local_128._8_8_);
      auVar20._0_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar20._4_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar20._8_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar20._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      uVar10 = *(undefined8 *)
                &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
                 .high;
      local_40.z = local_40.z - fVar85;
      local_50.z = local_50.z - fVar85;
      auVar37 = vinsertps_avx(auVar20,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),0x10);
      auVar83._0_4_ = (float)uVar10 + auVar37._0_4_;
      auVar83._4_4_ = (float)((ulong)uVar10 >> 0x20) + auVar37._4_4_;
      auVar83._8_4_ = auVar37._8_4_ + 0.0;
      auVar83._12_4_ = auVar37._12_4_ + 0.0;
      auVar28._8_4_ = 0x3f000000;
      auVar28._0_8_ = 0x3f0000003f000000;
      auVar28._12_4_ = 0x3f000000;
      auVar37 = vmulps_avx512vl(auVar83,auVar28);
      local_c8._8_4_ =
           ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
           + (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
             high) * 0.5;
      uVar10 = vmovlps_avx(auVar37);
      local_c8._0_4_ = (undefined4)uVar10;
      local_c8._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
      auVar37 = vinsertps_avx(ZEXT416((uint)(s->super_Tuple3<pbrt::Point3,_float>).x),
                              ZEXT416((uint)fVar50),0x10);
      auVar39 = vsubps_avx(auVar67,auVar37);
      auVar37 = vsubps_avx(auVar58,auVar37);
      local_40._0_8_ = vmovlps_avx(auVar39);
      local_50._0_8_ = vmovlps_avx(auVar37);
      PVar106 = SampleSphericalRectangle
                          ((Point3f *)&local_c8.__align,s,(Vector3f *)&local_40,
                           (Vector3f *)&local_50,(Point2f)local_128._0_8_,&local_cc);
      auVar61._0_4_ = PVar106.super_Tuple3<pbrt::Point3,_float>.z;
      auVar56._0_8_ = PVar106.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar56._8_56_ = auVar57;
      fVar48 = (s->super_Tuple3<pbrt::Point3,_float>).x;
      auVar80._4_4_ = fVar48;
      auVar80._0_4_ = fVar48;
      auVar80._8_4_ = fVar48;
      auVar80._12_4_ = fVar48;
      fVar49 = (s->super_Tuple3<pbrt::Point3,_float>).y;
      auVar91._4_4_ = fVar49;
      auVar91._0_4_ = fVar49;
      auVar91._8_4_ = fVar49;
      auVar91._12_4_ = fVar49;
      auVar40 = auVar56._0_16_;
      auVar39 = vmovshdup_avx(auVar40);
      fVar53 = (s->super_Tuple3<pbrt::Point3,_float>).z;
      auVar93._4_4_ = fVar53;
      auVar93._0_4_ = fVar53;
      auVar93._8_4_ = fVar53;
      auVar93._12_4_ = fVar53;
      auVar37 = vinsertps_avx(ZEXT416((uint)(pPVar1->super_Tuple3<pbrt::Point3,_float>).x),
                              ZEXT416((uint)(pPVar2->super_Tuple3<pbrt::Point3,_float>).x),0x10);
      fVar48 = PVar106.super_Tuple3<pbrt::Point3,_float>.x - fVar48;
      auVar86 = vsubps_avx(auVar37,auVar80);
      auVar37 = vinsertps_avx(ZEXT416((uint)(pPVar1->super_Tuple3<pbrt::Point3,_float>).y),
                              ZEXT416((uint)(pPVar2->super_Tuple3<pbrt::Point3,_float>).y),0x10);
      fVar49 = auVar39._0_4_ - fVar49;
      fVar53 = auVar61._0_4_ - fVar53;
      auVar81 = vsubps_avx(auVar37,auVar91);
      auVar39 = vinsertps_avx(ZEXT416((uint)(pPVar1->super_Tuple3<pbrt::Point3,_float>).z),
                              ZEXT416((uint)(pPVar2->super_Tuple3<pbrt::Point3,_float>).z),0x10);
      auVar54 = vmovshdup_avx(auVar86);
      fVar85 = auVar81._0_4_;
      auVar38 = vmovshdup_avx(auVar81);
      auVar37 = vblendps_avx(auVar81,auVar86,2);
      auVar87 = ZEXT416((uint)(auVar54._0_4_ * fVar85));
      auVar38 = vfmsub213ss_fma(auVar38,auVar86,auVar87);
      auVar54 = vfnmadd213ss_fma(auVar54,auVar81,auVar87);
      auVar87 = vsubps_avx(auVar39,auVar93);
      fVar50 = auVar38._0_4_ + auVar54._0_4_;
      auVar39 = vinsertps_avx(auVar87,auVar86,0x1c);
      auVar54 = vinsertps_avx(auVar87,auVar81,0x4c);
      auVar38 = vshufps_avx(auVar87,auVar87,0xe1);
      auVar105._0_4_ = auVar39._0_4_ * auVar54._0_4_;
      auVar105._4_4_ = auVar39._4_4_ * auVar54._4_4_;
      auVar105._8_4_ = auVar39._8_4_ * auVar54._8_4_;
      auVar105._12_4_ = auVar39._12_4_ * auVar54._12_4_;
      auVar37 = vfmsub213ps_fma(auVar37,auVar38,auVar105);
      auVar39 = vfnmadd213ps_fma(auVar54,auVar39,auVar105);
      auVar97._0_4_ = auVar37._0_4_ + auVar39._0_4_;
      auVar97._4_4_ = auVar37._4_4_ + auVar39._4_4_;
      auVar97._8_4_ = auVar37._8_4_ + auVar39._8_4_;
      auVar97._12_4_ = auVar37._12_4_ + auVar39._12_4_;
      auVar103._0_4_ = auVar97._0_4_ * auVar97._0_4_;
      auVar103._4_4_ = auVar97._4_4_ * auVar97._4_4_;
      auVar103._8_4_ = auVar97._8_4_ * auVar97._8_4_;
      auVar103._12_4_ = auVar97._12_4_ * auVar97._12_4_;
      auVar37 = vhaddps_avx(auVar103,auVar103);
      auVar37 = ZEXT416((uint)(fVar50 * fVar50 + auVar37._0_4_));
      auVar37 = vsqrtss_avx(auVar37,auVar37);
      fVar51 = auVar37._0_4_;
      auVar104._4_4_ = fVar51;
      auVar104._0_4_ = fVar51;
      auVar104._8_4_ = fVar51;
      auVar104._12_4_ = fVar51;
      auVar37 = vdivps_avx(auVar97,auVar104);
      bVar35 = mesh->reverseOrientation == mesh->transformSwapsHandedness;
      auVar98 = auVar37;
      if (!bVar35) {
        auVar98._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
        auVar98._8_4_ = auVar37._8_4_ ^ 0x80000000;
        auVar98._12_4_ = auVar37._12_4_ ^ 0x80000000;
      }
      auVar70._4_4_ = fVar48;
      auVar70._0_4_ = fVar48;
      auVar70._8_4_ = fVar48;
      auVar70._12_4_ = fVar48;
      auVar74._4_4_ = fVar53;
      auVar74._0_4_ = fVar53;
      auVar74._8_4_ = fVar53;
      auVar74._12_4_ = fVar53;
      auVar61._4_4_ = auVar61._0_4_;
      auVar61._8_4_ = auVar61._0_4_;
      auVar61._12_4_ = auVar61._0_4_;
      auVar39 = vshufps_avx(auVar40,auVar40,0x50);
      auVar84._0_4_ = fVar49 * fVar85;
      fVar48 = auVar81._4_4_;
      auVar84._4_4_ = fVar49 * fVar48;
      fVar53 = auVar81._8_4_;
      auVar84._8_4_ = fVar49 * fVar53;
      fVar52 = auVar81._12_4_;
      auVar84._12_4_ = fVar49 * fVar52;
      auVar37 = vfmadd213ps_fma(auVar70,auVar86,auVar84);
      auVar37 = vfmadd213ps_fma(auVar74,auVar87,auVar37);
      auVar71._0_4_ =
           auVar86._0_4_ * auVar86._0_4_ + fVar85 * fVar85 + auVar87._0_4_ * auVar87._0_4_;
      auVar71._4_4_ =
           auVar86._4_4_ * auVar86._4_4_ + fVar48 * fVar48 + auVar87._4_4_ * auVar87._4_4_;
      auVar71._8_4_ =
           auVar86._8_4_ * auVar86._8_4_ + fVar53 * fVar53 + auVar87._8_4_ * auVar87._8_4_;
      auVar71._12_4_ =
           auVar86._12_4_ * auVar86._12_4_ + fVar52 * fVar52 + auVar87._12_4_ * auVar87._12_4_;
      auVar37 = vdivps_avx(auVar37,auVar71);
      FVar47 = ctx->time;
      __return_storage_ptr__->set = true;
      *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar39;
      uVar10 = vmovlps_avx(auVar61);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar10;
      *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = FVar47;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = 0;
      uVar10 = vmovlps_avx(auVar98);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar10;
      *(uint *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
           (uint)bVar35 * (int)(fVar50 / fVar51) + (uint)!bVar35 * (int)-(fVar50 / fVar51);
      uVar10 = vmovlps_avx(auVar37);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = uVar10;
      *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) =
           ZEXT816(0) << 0x20;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = local_148 * local_cc;
      return __return_storage_ptr__;
    }
  }
  Sample((optional<pbrt::ShapeSample> *)&local_c8.__align,this,u);
  if (local_70 != false) {
    FVar47 = ctx->time;
    auVar34._4_4_ = local_c8._4_4_;
    auVar34._0_4_ = local_c8._0_4_;
    auVar34._8_4_ = local_c8._8_4_;
    auVar34._12_4_ = local_c8._12_4_;
    auVar18._0_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    auVar18._4_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    auVar18._8_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    auVar18._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    uVar10 = *(undefined8 *)
              &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
               high;
    auVar37 = vinsertps_avx(auVar34,ZEXT416((uint)local_c8._12_4_),0x10);
    auVar39 = vinsertps_avx(auVar18,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high)
                            ,0x10);
    fVar53 = ((float)local_c8._16_4_ + (float)local_c8._20_4_) * 0.5;
    auVar59._0_4_ = ((float)local_c8._4_4_ + auVar37._0_4_) * 0.5;
    auVar59._4_4_ = ((float)local_c8._8_4_ + auVar37._4_4_) * 0.5;
    auVar59._8_4_ = (auVar37._8_4_ + 0.0) * 0.5;
    auVar59._12_4_ = (auVar37._12_4_ + 0.0) * 0.5;
    auVar62._0_4_ = ((float)uVar10 + auVar39._0_4_) * 0.5;
    auVar62._4_4_ = ((float)((ulong)uVar10 >> 0x20) + auVar39._4_4_) * 0.5;
    auVar62._8_4_ = (auVar39._8_4_ + 0.0) * 0.5;
    auVar62._12_4_ = (auVar39._12_4_ + 0.0) * 0.5;
    fVar50 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              low + (ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
    auVar39 = vsubps_avx(auVar59,auVar62);
    fVar49 = auVar39._0_4_;
    auVar75._0_4_ = fVar49 * fVar49;
    auVar75._4_4_ = auVar39._4_4_ * auVar39._4_4_;
    auVar75._8_4_ = auVar39._8_4_ * auVar39._8_4_;
    auVar75._12_4_ = auVar39._12_4_ * auVar39._12_4_;
    auVar37 = vhaddps_avx(auVar75,auVar75);
    fVar85 = fVar53 - fVar50;
    fVar48 = auVar37._0_4_ + fVar85 * fVar85;
    if ((fVar48 != 0.0) || (NAN(fVar48))) {
      auVar54 = vsqrtss_avx(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48));
      auVar30._8_4_ = 0x80000000;
      auVar30._0_8_ = 0x8000000080000000;
      auVar30._12_4_ = 0x80000000;
      auVar38 = vxorps_avx512vl(ZEXT416((uint)fVar85),auVar30);
      auVar37 = vsubps_avx(auVar62,auVar59);
      fVar50 = fVar50 - fVar53;
      auVar60._0_4_ = auVar37._0_4_ * auVar37._0_4_;
      auVar60._4_4_ = auVar37._4_4_ * auVar37._4_4_;
      auVar60._8_4_ = auVar37._8_4_ * auVar37._8_4_;
      auVar60._12_4_ = auVar37._12_4_ * auVar37._12_4_;
      auVar37 = vhaddps_avx(auVar60,auVar60);
      fVar48 = auVar54._0_4_;
      auVar76._0_4_ = auVar38._0_4_ / fVar48;
      auVar76._4_12_ = auVar38._4_12_;
      auVar89._0_4_ = fVar49 / fVar48;
      auVar89._4_12_ = auVar39._4_12_;
      auVar39 = vmovshdup_avx(auVar39);
      auVar72._0_4_ = auVar39._0_4_ / fVar48;
      auVar72._4_12_ = auVar39._4_12_;
      auVar54 = vfnmadd132ss_fma(auVar72,ZEXT416((uint)(auVar76._0_4_ * (float)local_c8._48_4_)),
                                 ZEXT416((uint)local_c8._44_4_));
      auVar39 = vfmsub213ss_fma(auVar76,ZEXT416((uint)local_c8._48_4_),
                                ZEXT416((uint)(auVar76._0_4_ * (float)local_c8._48_4_)));
      auVar39 = vfnmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ + auVar39._0_4_)),auVar89,
                                 ZEXT416((uint)local_c8._40_4_));
      auVar31._8_4_ = 0x7fffffff;
      auVar31._0_8_ = 0x7fffffff7fffffff;
      auVar31._12_4_ = 0x7fffffff;
      auVar39 = vandps_avx512vl(auVar39,auVar31);
      fVar48 = (float)local_c8._80_4_ / (auVar39._0_4_ / (auVar37._0_4_ + fVar50 * fVar50));
      if (ABS(fVar48) != INFINITY) {
        aVar33._4_4_ = local_c8._4_4_;
        aVar33._0_4_ = local_c8._0_4_;
        __return_storage_ptr__->set = local_70;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_c8._64_8_;
        (__return_storage_ptr__->optionalValue).__align = aVar33;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
             CONCAT44(local_c8._12_4_,local_c8._8_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
             CONCAT44(local_c8._20_4_,local_c8._16_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
             CONCAT44(local_c8._28_4_,FVar47);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_c8._32_8_;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
             CONCAT44(local_c8._44_4_,local_c8._40_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
             CONCAT44(local_c8._52_4_,local_c8._48_4_);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_c8._56_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_c8._72_8_;
        *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = fVar48;
        return __return_storage_ptr__;
      }
    }
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[4]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
             ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
}

Assistant:

pstd::optional<ShapeSample> BilinearPatch::Sample(const ShapeSampleContext &ctx,
                                                  Point2f u) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Find normalized vectors to corners of bilinear patch
    Vector3f v00 = Normalize(p00 - ctx.p()), v10 = Normalize(p10 - ctx.p());
    Vector3f v01 = Normalize(p01 - ctx.p()), v11 = Normalize(p11 - ctx.p());

    if (IsRectangle(mesh) && !mesh->imageDistribution &&
        SphericalQuadArea(v00, v10, v11, v01) > MinSphericalSampleArea) {
        // Sample direction to rectanglular bilinear patch
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Warp uniform sample _u_ to account for incident $\cos \theta$ factor
            // Compute $\cos \theta$ weights for rectangle seen from _ctx.p()_
            Point3f rp = ctx.p();
            pstd::array<Float, 4> w = pstd::array<Float, 4>{
                std::max<Float>(0.01, AbsDot(Normalize(p00 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p10 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p01 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p11 - rp), ctx.ns))};

            u = SampleBilinear(u, w);
            pdf *= BilinearPDF(u, w);
        }
        // Sample spherical rectangle at reference point $\pt{}$
        Float quadPDF;
        Point3f p =
            SampleSphericalRectangle(ctx.p(), p00, p10 - p00, p01 - p00, u, &quadPDF);
        pdf *= quadPDF;

        // Compute surface normal and $(u,v)$ for sampled point on rectangle
        Normal3f n = Normal3f(Normalize(Cross(p10 - p00, p01 - p00)));
        if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;
        Point2f uv(Dot(p - p00, p10 - p00) / DistanceSquared(p10, p00),
                   Dot(p - p00, p01 - p00) / DistanceSquared(p01, p00));

        return ShapeSample{Interaction(p, n, ctx.time, uv), pdf};

    } else {
        // Uniformly sample shape and compute incident direction _wi_
        pstd::optional<ShapeSample> ss = Sample(u);
        DCHECK(ss.has_value());
        ss->intr.time = ctx.time;
        Vector3f wi = ss->intr.p() - ctx.p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);

        // Convert uniform area sample PDF in _ss_ to solid angle measure
        ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
        if (IsInf(ss->pdf))
            return {};

        return ss;
    }
}